

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int arkCompleteStep(ARKodeMem ark_mem,sunrealtype dsm)

{
  double dVar1;
  ARKAccumError AVar2;
  int iVar3;
  ARKodeHAdaptMem pAVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  sunrealtype tmp2;
  sunrealtype tmp1;
  
  dVar5 = ark_mem->h;
  dVar1 = ark_mem->tn;
  if (ark_mem->use_compensated_sums == 0) {
    dVar7 = dVar1 + dVar5;
  }
  else {
    dVar6 = dVar5 - ark_mem->terr;
    dVar7 = dVar6 + dVar1;
    ark_mem->terr = (dVar7 - dVar1) - dVar6;
  }
  ark_mem->tcur = dVar7;
  if ((ark_mem->tstopset != 0) &&
     (dVar1 = ark_mem->tstop,
     ABS(dVar7 - dVar1) <= (ABS(dVar5) + ABS(dVar7)) * ark_mem->uround * 100.0)) {
    ark_mem->tcur = dVar1;
    dVar7 = dVar1;
  }
  AVar2 = ark_mem->AccumErrorType;
  if (AVar2 != ARK_ACCUMERROR_NONE) {
    if (AVar2 == ARK_ACCUMERROR_SUM) {
      dVar5 = ark_mem->AccumError + dsm;
    }
    else if (AVar2 == ARK_ACCUMERROR_MAX) {
      dVar5 = dsm;
      if (dsm <= ark_mem->AccumError) {
        dVar5 = ark_mem->AccumError;
      }
    }
    else {
      dVar5 = dVar5 * dsm + ark_mem->AccumError;
    }
    ark_mem->AccumError = dVar5;
  }
  if ((ark_mem->ProcessStep == (ARKPostProcessFn)0x0) ||
     (iVar3 = (*ark_mem->ProcessStep)(dVar7,ark_mem->ycur,ark_mem->ps_data), iVar3 == 0)) {
    if ((ark_mem->interp == (ARKInterp)0x0) ||
       (iVar3 = arkInterpUpdate(ark_mem,ark_mem->interp,ark_mem->tcur), iVar3 == 0)) {
      N_VScale(0x3ff0000000000000,ark_mem->ycur,ark_mem->yn);
      ark_mem->fn_is_current = 0;
      pAVar4 = ark_mem->hadapt_mem;
      if (pAVar4->hcontroller != (SUNAdaptController)0x0) {
        iVar3 = SUNAdaptController_UpdateH(ark_mem->h,dsm);
        if (iVar3 != 0) {
          arkProcessError(ark_mem,-0x2f,0xaba,"arkCompleteStep",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                          ,"Failure updating controller object");
          return -0x2f;
        }
        pAVar4 = ark_mem->hadapt_mem;
      }
      ark_mem->nst = ark_mem->nst + 1;
      ark_mem->checkpoint_step_idx = ark_mem->checkpoint_step_idx + 1;
      ark_mem->hold = ark_mem->h;
      ark_mem->tn = ark_mem->tcur;
      ark_mem->hprime = ark_mem->h * ark_mem->eta;
      pAVar4->etamax = pAVar4->growth;
      ark_mem->initsetup = 0;
      ark_mem->firststage = 0;
      iVar3 = 0;
    }
  }
  else {
    iVar3 = -0x25;
  }
  return iVar3;
}

Assistant:

int arkCompleteStep(ARKodeMem ark_mem, sunrealtype dsm)
{
  int retval;
  sunrealtype troundoff;

  /* Set current time to the end of the step (in case the last
     stage time does not coincide with the step solution time).
     If tstop is enabled, it is possible for tn + h to be past
     tstop by roundoff, and in that case, we reset tn (after
     incrementing by h) to tstop. */

  /* During long-time integration, roundoff can creep into tcur.
     Compensated summation fixes this but with increased cost, so it is optional. */
  if (ark_mem->use_compensated_sums)
  {
    sunCompensatedSum(ark_mem->tn, ark_mem->h, &ark_mem->tcur, &ark_mem->terr);
  }
  else { ark_mem->tcur = ark_mem->tn + ark_mem->h; }

  if (ark_mem->tstopset)
  {
    troundoff = FUZZ_FACTOR * ark_mem->uround *
                (SUNRabs(ark_mem->tcur) + SUNRabs(ark_mem->h));
    if (SUNRabs(ark_mem->tcur - ark_mem->tstop) <= troundoff)
    {
      ark_mem->tcur = ark_mem->tstop;
    }
  }

  /* store this step's contribution to accumulated temporal error */
  if (ark_mem->AccumErrorType != ARK_ACCUMERROR_NONE)
  {
    if (ark_mem->AccumErrorType == ARK_ACCUMERROR_MAX)
    {
      ark_mem->AccumError = SUNMAX(dsm, ark_mem->AccumError);
    }
    else if (ark_mem->AccumErrorType == ARK_ACCUMERROR_SUM)
    {
      ark_mem->AccumError += dsm;
    }
    else /* ARK_ACCUMERROR_AVG */ { ark_mem->AccumError += (dsm * ark_mem->h); }
  }

  /* apply user-supplied step postprocessing function (if supplied) */
  if (ark_mem->ProcessStep != NULL)
  {
    retval = ark_mem->ProcessStep(ark_mem->tcur, ark_mem->ycur, ark_mem->ps_data);
    if (retval != 0) { return (ARK_POSTPROCESS_STEP_FAIL); }
  }

  /* update interpolation structure

     NOTE: This must be called before updating yn with ycur as the interpolation
     module may need to save tn, yn from the start of this step. */
  if (ark_mem->interp != NULL)
  {
    retval = arkInterpUpdate(ark_mem, ark_mem->interp, ark_mem->tcur);
    if (retval != ARK_SUCCESS) { return (retval); }
  }

  /* update yn to current solution */
  N_VScale(ONE, ark_mem->ycur, ark_mem->yn);
  ark_mem->fn_is_current = SUNFALSE;

  /* Notify time step controller object of successful step */
  if (ark_mem->hadapt_mem->hcontroller)
  {
    retval = SUNAdaptController_UpdateH(ark_mem->hadapt_mem->hcontroller,
                                        ark_mem->h, dsm);
    if (retval != SUN_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_CONTROLLER_ERR, __LINE__, __func__, __FILE__,
                      "Failure updating controller object");
      return (ARK_CONTROLLER_ERR);
    }
  }

  /* update scalar quantities */
  ark_mem->nst++;
  ark_mem->checkpoint_step_idx++;
  ark_mem->hold   = ark_mem->h;
  ark_mem->tn     = ark_mem->tcur;
  ark_mem->hprime = ark_mem->h * ark_mem->eta;

  /* Reset growth factor for subsequent time step */
  ark_mem->hadapt_mem->etamax = ark_mem->hadapt_mem->growth;

  /* Turn off flag indicating initial step and first stage */
  ark_mem->initsetup  = SUNFALSE;
  ark_mem->firststage = SUNFALSE;

  return (ARK_SUCCESS);
}